

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv_relation.cpp
# Opt level: O3

void __thiscall
duckdb::ReadCSVRelation::ReadCSVRelation
          (ReadCSVRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *input,named_parameter_map_t *options,string *alias_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::ColumnDefinition,_true> *this_00;
  pointer pcVar2;
  undefined8 uVar3;
  ClientContext *this_01;
  mapped_type *pmVar4;
  reference pvVar5;
  string *psVar6;
  LogicalType *this_02;
  size_type __n;
  initializer_list<duckdb::Value> __l;
  child_list_t<Value> column_names;
  CSVReaderOptions csv_options;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_668;
  _Any_data local_648;
  code *local_638;
  code *local_630;
  Value local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_5e0;
  shared_ptr<duckdb::Relation,_true> local_5d8;
  vector<duckdb::Value,_true> local_5c0;
  string local_5a8;
  string local_588;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_568;
  Value local_550;
  undefined4 local_510;
  undefined2 local_50c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_508;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_4b0;
  Value local_478;
  CSVReaderOptions local_438;
  
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"read_csv_auto","");
  MultiFileReader::CreateValueFromFileList((Value *)&local_438,input);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_438;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_5c0,__l,
             (allocator_type *)&local_510);
  local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TableFunctionRelation::TableFunctionRelation
            (&this->super_TableFunctionRelation,context,&local_588,&local_5c0,&local_5d8,false);
  if (local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_5c0);
  Value::~Value((Value *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  (this->super_TableFunctionRelation).super_Relation._vptr_Relation =
       (_func_int **)&PTR__ReadCSVRelation_0199a000;
  local_5e8 = &(this->alias).field_2;
  (this->alias)._M_dataplus._M_p = (pointer)local_5e8;
  pcVar2 = (alias_p->_M_dataplus)._M_p;
  paVar1 = &alias_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&alias_p->field_2 + 8);
    local_5e8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->alias).field_2 + 8) = uVar3;
  }
  else {
    (this->alias)._M_dataplus._M_p = pcVar2;
    (this->alias).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->alias)._M_string_length = alias_p->_M_string_length;
  (alias_p->_M_dataplus)._M_p = (pointer)paVar1;
  alias_p->_M_string_length = 0;
  (alias_p->field_2)._M_local_buf[0] = '\0';
  local_508._M_buckets = &local_508._M_single_bucket;
  local_510 = 0x10000;
  local_50c = 1;
  local_508._M_bucket_count = 1;
  local_508._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_508._M_element_count = 0;
  local_508._M_rehash_policy._M_max_load_factor = 1.0;
  local_508._M_rehash_policy._M_next_resize = 0;
  local_508._M_single_bucket = (__node_base_ptr)0x0;
  local_4d0 = &local_4c0;
  local_4c0 = 0x656d616e656c6966;
  local_4c8 = 8;
  local_4b8 = 0;
  local_4b0._M_buckets = &local_4b0._M_single_bucket;
  local_4b0._M_bucket_count = 1;
  local_4b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_4b0._M_element_count = 0;
  local_4b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_4b0._M_rehash_policy._M_next_resize = 0;
  local_4b0._M_single_bucket = (__node_base_ptr)0x0;
  InitializeAlias(this,input);
  CSVReaderOptions::CSVReaderOptions(&local_438);
  this_01 = shared_ptr<duckdb::ClientContext,_true>::operator->(context);
  local_648._8_8_ = 0;
  local_648._M_unused._M_object = operator_new(0x30);
  *(CSVReaderOptions **)local_648._M_unused._0_8_ = &local_438;
  *(shared_ptr<duckdb::ClientContext,_true> **)((long)local_648._M_unused._0_8_ + 8) = context;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> **
   )((long)local_648._M_unused._0_8_ + 0x10) = input;
  *(named_parameter_map_t **)((long)local_648._M_unused._0_8_ + 0x18) = options;
  *(ReadCSVRelation **)((long)local_648._M_unused._0_8_ + 0x20) = this;
  *(allocator_type **)((long)local_648._M_unused._0_8_ + 0x28) = (allocator_type *)&local_510;
  local_630 = ::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/relation/read_csv_relation.cpp:110:6)>
              ::_M_invoke;
  local_638 = ::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/relation/read_csv_relation.cpp:110:6)>
              ::_M_manager;
  ClientContext::RunFunctionInTransaction(this_01,(function<void_()> *)&local_648,true);
  if (local_638 != (code *)0x0) {
    (*local_638)(&local_648,&local_648,3);
  }
  CSVReaderOptions::ToNamedParameters(&local_438,options);
  Value::BOOLEAN((Value *)&local_648,false);
  local_550.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_550 + 0x10U);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"auto_detect","");
  pmVar4 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)options,(key_type *)&local_550);
  Value::operator=(pmVar4,(Value *)&local_648);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_550.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_550 + 0x10U)) {
    operator_delete((void *)local_550.type_._0_8_);
  }
  Value::~Value((Value *)&local_648);
  local_5e0 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_TableFunctionRelation).named_parameters;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_5e0,options);
  local_668.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_668.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_668.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->super_TableFunctionRelation).columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->super_TableFunctionRelation).columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this_00 = &(this->super_TableFunctionRelation).columns;
    __n = 0;
    do {
      pvVar5 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n);
      psVar6 = ColumnDefinition::Name_abi_cxx11_(pvVar5);
      pvVar5 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n);
      this_02 = ColumnDefinition::Type(pvVar5);
      LogicalType::ToString_abi_cxx11_(&local_5a8,this_02);
      Value::Value(&local_550,&local_5a8);
      local_648._M_unused._M_object = &local_638;
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_648,pcVar2,pcVar2 + psVar6->_M_string_length);
      Value::Value(&local_628,&local_550);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_668,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                  *)&local_648);
      Value::~Value(&local_628);
      if ((code **)local_648._M_unused._0_8_ != &local_638) {
        operator_delete(local_648._M_unused._M_object);
      }
      Value::~Value(&local_550);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->super_TableFunctionRelation).columns.
                                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  .
                                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_TableFunctionRelation).columns.
                                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  .
                                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x7b425ed097b425ed));
  }
  if (local_510._3_1_ == '\0') {
    local_648._M_unused._M_object = &local_638;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"columns","");
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_668.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_668.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_668.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_668.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_668.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::STRUCT(&local_478,(child_list_t<Value> *)&local_568);
    pmVar4 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_5e0,(key_type *)&local_648);
    Value::operator=(pmVar4,&local_478);
    Value::~Value(&local_478);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_568);
    if ((code **)local_648._M_unused._0_8_ != &local_638) {
      operator_delete(local_648._M_unused._M_object);
    }
  }
  local_648._M_unused._M_object = &local_638;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"names","");
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_648);
  if ((code **)local_648._M_unused._0_8_ != &local_638) {
    operator_delete(local_648._M_unused._M_object);
  }
  local_648._M_unused._M_object = &local_638;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"types","");
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_648);
  if ((code **)local_648._M_unused._0_8_ != &local_638) {
    operator_delete(local_648._M_unused._M_object);
  }
  local_648._M_unused._M_object = &local_638;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"dtypes","");
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_648);
  if ((code **)local_648._M_unused._0_8_ != &local_638) {
    operator_delete(local_648._M_unused._M_object);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_668);
  CSVReaderOptions::~CSVReaderOptions(&local_438);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_4b0);
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_508);
  return;
}

Assistant:

ReadCSVRelation::ReadCSVRelation(const shared_ptr<ClientContext> &context, const vector<string> &input,
                                 named_parameter_map_t &&options, string alias_p)
    : TableFunctionRelation(context, "read_csv_auto", {MultiFileReader::CreateValueFromFileList(input)}, nullptr,
                            false),
      alias(std::move(alias_p)) {
	MultiFileOptions file_options;

	InitializeAlias(input);
	CSVReaderOptions csv_options;
	context->RunFunctionInTransaction(
	    [&]() { csv_options = ReadCSVRelationBind(context, input, options, columns, file_options); });

	// Capture the options potentially set/altered by the auto-detection phase
	csv_options.ToNamedParameters(options);

	// No need to auto-detect again
	options["auto_detect"] = Value::BOOLEAN(false);
	SetNamedParameters(std::move(options));

	child_list_t<Value> column_names;
	for (idx_t i = 0; i < columns.size(); i++) {
		column_names.push_back(make_pair(columns[i].Name(), Value(columns[i].Type().ToString())));
	}

	if (!file_options.union_by_name) {
		AddNamedParameter("columns", Value::STRUCT(std::move(column_names)));
	}
	RemoveNamedParameterIfExists("names");
	RemoveNamedParameterIfExists("types");
	RemoveNamedParameterIfExists("dtypes");
}